

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SignTransaction
          (DescriptorScriptPubKeyMan *this,CMutableTransaction *tx,
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *coins,int sighash,
          map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          *input_errors)

{
  long lVar1;
  bool bVar2;
  DescriptorScriptPubKeyMan *this_00;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *in_RSI;
  long in_FS_OFFSET;
  pair<const_COutPoint,_Coin> *coin_pair;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *__range1;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> coin_keys;
  const_iterator __end1;
  const_iterator __begin1;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> keys;
  int in_stack_000000a4;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *in_stack_000000a8;
  SigningProvider *in_stack_000000b0;
  CMutableTransaction *in_stack_000000b8;
  _Rb_tree_const_iterator<std::pair<const_COutPoint,_Coin>_> *in_stack_ffffffffffffff58;
  FlatSigningProvider *in_stack_ffffffffffffff60;
  FlatSigningProvider *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff97;
  CScript *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<FlatSigningProvider>();
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  begin((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
         *)in_stack_ffffffffffffff60);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  end((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)in_stack_ffffffffffffff60);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68,
                                 (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = (DescriptorScriptPubKeyMan *)
              std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_Coin>_>::operator*
                        (in_stack_ffffffffffffff58);
    GetSigningProvider(this_00,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *
                       )in_stack_ffffffffffffff58);
    if (bVar2) {
      std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::operator->
                ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
                 in_stack_ffffffffffffff58);
      std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::operator*
                ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
                 in_stack_ffffffffffffff68);
      FlatSigningProvider::Merge(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
              ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
               in_stack_ffffffffffffff68);
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_Coin>_>::operator++
              (in_stack_ffffffffffffff58);
  }
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::get
            ((unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> *)
             in_stack_ffffffffffffff58);
  bVar2 = ::SignTransaction(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,
                            (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                             *)keys._M_t.
                               super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                               .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl);
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            (in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool DescriptorScriptPubKeyMan::SignTransaction(CMutableTransaction& tx, const std::map<COutPoint, Coin>& coins, int sighash, std::map<int, bilingual_str>& input_errors) const
{
    std::unique_ptr<FlatSigningProvider> keys = std::make_unique<FlatSigningProvider>();
    for (const auto& coin_pair : coins) {
        std::unique_ptr<FlatSigningProvider> coin_keys = GetSigningProvider(coin_pair.second.out.scriptPubKey, true);
        if (!coin_keys) {
            continue;
        }
        keys->Merge(std::move(*coin_keys));
    }

    return ::SignTransaction(tx, keys.get(), coins, sighash, input_errors);
}